

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metrohash128crc.cpp
# Opt level: O2

void metrohash128crc_1(uint8_t *key,uint64_t len,uint32_t seed,uint8_t *out)

{
  uint *puVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  uint *puVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  uint8_t *puVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  
  lVar8 = (ulong)seed * 0x2f5870a5 + len;
  lVar12 = (ulong)seed * 0x7bdec03b + len;
  uVar3 = lVar8 + 0xdaf812fade1589fb;
  uVar6 = lVar12 + 0x40f9d9a67898eb79;
  puVar5 = (uint *)key;
  if (0x1f < len) {
    uVar13 = lVar12 + 0x60e25d3baf065edb;
    uVar9 = lVar8 + 0xe72a3b80ca927bd9;
    do {
      uVar4 = crc32(uVar3,*(undefined8 *)puVar5);
      uVar7 = crc32(uVar6,*(undefined8 *)(puVar5 + 2));
      uVar14 = crc32(uVar13,*(undefined8 *)(puVar5 + 4));
      uVar10 = crc32(uVar9,*(undefined8 *)(puVar5 + 6));
      puVar5 = puVar5 + 8;
      uVar3 = uVar4 ^ uVar3;
      uVar6 = uVar7 ^ uVar6;
      uVar13 = uVar14 ^ uVar13;
      uVar9 = uVar10 ^ uVar9;
    } while (puVar5 <= key + (len - 0x20));
    uVar4 = (uVar9 + uVar3) * 0xc83a91e1 + uVar6;
    uVar13 = (uVar4 >> 0x22 | uVar4 * 0x40000000) * 0x8648dbdb ^ uVar13;
    uVar4 = (uVar13 + uVar6) * 0x8648dbdb + uVar3;
    uVar9 = (uVar4 >> 0x25 | uVar4 * 0x8000000) * 0xc83a91e1 ^ uVar9;
    uVar4 = (uVar13 + uVar3) * 0xc83a91e1 + uVar9;
    uVar13 = (uVar9 + uVar6) * 0x8648dbdb + uVar13;
    uVar3 = uVar3 ^ (uVar4 >> 0x22 | uVar4 * 0x40000000) * 0x8648dbdb;
    uVar6 = uVar6 ^ (uVar13 >> 0x25 | uVar13 * 0x8000000) * 0xc83a91e1;
  }
  puVar11 = key + (len - (long)puVar5);
  if (0xf < (long)puVar11) {
    lVar8 = *(long *)puVar5;
    puVar1 = puVar5 + 2;
    puVar5 = puVar5 + 4;
    uVar3 = lVar8 * 0x7bdec03b + uVar3;
    uVar6 = *(long *)puVar1 * 0x7bdec03b + uVar6;
    uVar3 = uVar3 >> 0x22 | uVar3 * 0x40000000;
    uVar9 = uVar6 >> 0x22 | uVar6 * 0x40000000;
    uVar6 = uVar9 * 0x2f5870a5;
    uVar13 = uVar3 * 0x16e8b05e33f3b607 + uVar6;
    uVar3 = (uVar13 >> 0x1e | uVar13 << 0x22) * 0x8648dbdb ^ uVar3 * 0x2f5870a5;
    uVar13 = uVar9 * 0x8c197ea3900ca59 + uVar3;
    puVar11 = key + (len - (long)puVar5);
    uVar6 = (uVar13 >> 0x1e | uVar13 << 0x22) * 0xc83a91e1 ^ uVar6;
  }
  if (7 < (long)puVar11) {
    lVar8 = *(long *)puVar5;
    puVar5 = puVar5 + 2;
    uVar3 = lVar8 * 0x7bdec03b + uVar3;
    uVar3 = uVar3 >> 0x24 | uVar3 * 0x10000000;
    uVar13 = uVar3 * 0x16e8b05e33f3b607 + uVar6;
    uVar3 = (uVar13 >> 0x17 | uVar13 << 0x29) * 0x8648dbdb ^ uVar3 * 0x2f5870a5;
    puVar11 = key + (len - (long)puVar5);
  }
  if (3 < (long)puVar11) {
    uVar2 = *puVar5;
    puVar5 = puVar5 + 1;
    uVar9 = crc32(uVar3,(ulong)uVar2);
    uVar13 = (uVar9 ^ uVar6) * 0x2f5870a5 + uVar3;
    uVar6 = (uVar13 >> 0x13 | uVar13 << 0x2d) * 0xc83a91e1 ^ uVar9 ^ uVar6;
    puVar11 = key + (len - (long)puVar5);
  }
  if (1 < (long)puVar11) {
    uVar2 = *puVar5;
    puVar5 = (uint *)((long)puVar5 + 2);
    puVar11 = key + (len - (long)puVar5);
    uVar9 = crc32(uVar6,(ulong)(ushort)uVar2);
    uVar13 = (uVar9 ^ uVar3) * 0x7bdec03b + uVar6;
    uVar3 = (uVar13 >> 0xd | uVar13 << 0x33) * 0x8648dbdb ^ uVar9 ^ uVar3;
  }
  if (0 < (long)puVar11) {
    uVar9 = crc32(uVar3,(ulong)(byte)*puVar5);
    uVar13 = (uVar9 ^ uVar6) * 0x2f5870a5 + uVar3;
    uVar6 = (uVar13 >> 0x11 | uVar13 << 0x2f) * 0xc83a91e1 ^ uVar9 ^ uVar6;
  }
  uVar13 = uVar3 * 0xc83a91e1 + uVar6;
  lVar12 = (uVar13 >> 0xb | uVar13 << 0x35) + uVar3;
  uVar3 = uVar6 * 0x8648dbdb + lVar12;
  lVar8 = (uVar3 >> 0x1a | uVar3 << 0x26) + uVar6;
  uVar3 = lVar12 * 0xc83a91e1 + lVar8;
  lVar12 = (uVar3 >> 0xb | uVar3 << 0x35) + lVar12;
  uVar3 = lVar8 * 0x8648dbdb + lVar12;
  *(long *)out = lVar12;
  *(ulong *)(out + 8) = (uVar3 >> 0x1a | uVar3 << 0x26) + lVar8;
  return;
}

Assistant:

void metrohash128crc_1(const uint8_t * key, uint64_t len, uint32_t seed, uint8_t * out)
{
    static const uint64_t k0 = 0xC83A91E1;
    static const uint64_t k1 = 0x8648DBDB;
    static const uint64_t k2 = 0x7BDEC03B;
    static const uint64_t k3 = 0x2F5870A5;

    const uint8_t * ptr = reinterpret_cast<const uint8_t*>(key);
    const uint8_t * const end = ptr + len;
    
    uint64_t v[4];
    
    v[0] = ((static_cast<uint64_t>(seed) - k0) * k3) + len;
    v[1] = ((static_cast<uint64_t>(seed) + k1) * k2) + len;
    
    if (len >= 32)
    {        
        v[2] = ((static_cast<uint64_t>(seed) + k0) * k2) + len;
        v[3] = ((static_cast<uint64_t>(seed) - k1) * k3) + len;

        do
        {
            v[0] ^= _mm_crc32_u64(v[0], read_u64(ptr)); ptr += 8;
            v[1] ^= _mm_crc32_u64(v[1], read_u64(ptr)); ptr += 8;
            v[2] ^= _mm_crc32_u64(v[2], read_u64(ptr)); ptr += 8;
            v[3] ^= _mm_crc32_u64(v[3], read_u64(ptr)); ptr += 8;
        }
        while (ptr <= (end - 32));

        v[2] ^= rotate_right(((v[0] + v[3]) * k0) + v[1], 34) * k1;
        v[3] ^= rotate_right(((v[1] + v[2]) * k1) + v[0], 37) * k0;
        v[0] ^= rotate_right(((v[0] + v[2]) * k0) + v[3], 34) * k1;
        v[1] ^= rotate_right(((v[1] + v[3]) * k1) + v[2], 37) * k0;
    }
    
    if ((end - ptr) >= 16)
    {
        v[0] += read_u64(ptr) * k2; ptr += 8; v[0] = rotate_right(v[0],34) * k3;
        v[1] += read_u64(ptr) * k2; ptr += 8; v[1] = rotate_right(v[1],34) * k3;
        v[0] ^= rotate_right((v[0] * k2) + v[1], 30) * k1;
        v[1] ^= rotate_right((v[1] * k3) + v[0], 30) * k0;
    }
    
    if ((end - ptr) >= 8)
    {
        v[0] += read_u64(ptr) * k2; ptr += 8; v[0] = rotate_right(v[0],36) * k3;
        v[0] ^= rotate_right((v[0] * k2) + v[1], 23) * k1;
    }
    
    if ((end - ptr) >= 4)
    {
        v[1] ^= _mm_crc32_u64(v[0], read_u32(ptr)); ptr += 4;
        v[1] ^= rotate_right((v[1] * k3) + v[0], 19) * k0;
    }
    
    if ((end - ptr) >= 2)
    {
        v[0] ^= _mm_crc32_u64(v[1], read_u16(ptr)); ptr += 2;
        v[0] ^= rotate_right((v[0] * k2) + v[1], 13) * k1;
    }
    
    if ((end - ptr) >= 1)
    {
        v[1] ^= _mm_crc32_u64(v[0], read_u8 (ptr));
        v[1] ^= rotate_right((v[1] * k3) + v[0], 17) * k0;
    }
    
    v[0] += rotate_right((v[0] * k0) + v[1], 11);
    v[1] += rotate_right((v[1] * k1) + v[0], 26);
    v[0] += rotate_right((v[0] * k0) + v[1], 11);
    v[1] += rotate_right((v[1] * k1) + v[0], 26);

    memcpy(out, v, 16);
}